

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O1

void __thiscall UnitTest1::CodeGenTest::ParserGenTest1(CodeGenTest *this)

{
  char *in_RSI;
  MyErrorHandler errhandler;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  ParserEM64T<unsigned_char> parser;
  Stage1Runner runner;
  ErrorHandler local_5c8;
  StringLogger local_5c0;
  Grammar<unsigned_char> local_588;
  ParserEM64T<unsigned_char> local_490;
  Stage1Runner local_298;
  
  LoadGrammar<unsigned_char>(&local_588,in_RSI);
  ::asmjit::StringLogger::StringLogger(&local_5c0);
  ::asmjit::ErrorHandler::ErrorHandler(&local_5c8);
  local_5c8._vptr_ErrorHandler = (_func_int **)&PTR__ErrorHandler_001c92d0;
  Centaurus::ParserEM64T<unsigned_char>::ParserEM64T
            (&local_490,&local_588,&local_5c0.super_Logger,&local_5c8);
  Centaurus::Stage1Runner::Stage1Runner
            (&local_298,"../../datasets/citylots.json",&local_490.super_IParser,0x800000,8,false,
             false);
  Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(&local_298.super_BaseRunner);
  pthread_join(local_298.super_BaseRunner.m_thread,(void **)0x0);
  Centaurus::Stage1Runner::~Stage1Runner(&local_298);
  local_490.super_IParser._vptr_IParser = (_func_int **)&PTR__ParserEM64T_001c9928;
  ::asmjit::CodeHolder::~CodeHolder(&local_490.m_code);
  ::asmjit::JitRuntime::~JitRuntime(&local_490.m_runtime);
  ::asmjit::ErrorHandler::~ErrorHandler(&local_5c8);
  ::asmjit::StringLogger::~StringLogger(&local_5c0);
  Centaurus::Grammar<unsigned_char>::~Grammar(&local_588);
  return;
}

Assistant:

TEST_METHOD(ParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");

        asmjit::StringLogger logger;

        MyErrorHandler errhandler;

        ParserEM64T<unsigned char> parser(grammar, &logger, &errhandler);

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		runner.start();
        runner.wait();

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        //Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }